

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O1

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  ushort uVar1;
  ushort uVar2;
  stbrp_node *psVar3;
  undefined1 auVar4 [16];
  stbrp_context *psVar5;
  int iVar6;
  ulong uVar7;
  undefined8 uVar8;
  long extraout_RAX;
  long lVar9;
  int *piVar10;
  int iVar11;
  undefined4 in_register_00000014;
  ulong uVar12;
  stbrp_node **ppsVar13;
  stbrp_node *psVar14;
  stbrp_node **in_R8;
  stbrp_node *psVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  stbrp_context *psVar19;
  stbrp_node **ppsVar20;
  stbrp_context *psVar21;
  stbrp_rect *psVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int waste;
  int local_98;
  uint local_94;
  stbrp_node **local_90;
  int local_88;
  int local_84;
  ulong local_80;
  undefined8 local_78;
  ulong local_70;
  stbrp_context *local_68;
  size_t local_60;
  stbrp_node **local_58;
  ulong local_50;
  stbrp_rect *local_48;
  stbrp_rect *local_40;
  ulong local_38;
  
  auVar4 = _DAT_0017e680;
  local_78 = CONCAT44(in_register_00000014,num_rects);
  uVar18 = (ulong)(uint)num_rects;
  if (0 < num_rects) {
    lVar9 = uVar18 - 1;
    auVar24._8_4_ = (int)lVar9;
    auVar24._0_8_ = lVar9;
    auVar24._12_4_ = (int)((ulong)lVar9 >> 0x20);
    piVar10 = &rects[1].was_packed;
    uVar12 = 0;
    auVar24 = auVar24 ^ _DAT_0017e680;
    auVar25 = _DAT_0017e6e0;
    do {
      auVar26 = auVar25 ^ auVar4;
      if ((bool)(~(auVar26._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar26._0_4_ ||
                  auVar24._4_4_ < auVar26._4_4_) & 1)) {
        piVar10[-4] = (int)uVar12;
      }
      if ((auVar26._12_4_ != auVar24._12_4_ || auVar26._8_4_ <= auVar24._8_4_) &&
          auVar26._12_4_ <= auVar24._12_4_) {
        *piVar10 = (int)uVar12 + 1;
      }
      uVar12 = uVar12 + 2;
      lVar9 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 2;
      auVar25._8_8_ = lVar9 + 2;
      piVar10 = piVar10 + 8;
    } while ((num_rects + 1U & 0xfffffffe) != uVar12);
  }
  local_60 = (size_t)num_rects;
  qsort(rects,local_60,0x10,rect_height_compare);
  if (0 < num_rects) {
    ppsVar13 = &context->active_head;
    uVar12 = 0;
    local_68 = context;
    local_58 = ppsVar13;
    local_50 = uVar18;
    local_48 = rects;
    do {
      psVar22 = rects + uVar12;
      uVar1 = rects[uVar12].w;
      uVar7 = (ulong)uVar1;
      if (uVar1 == 0) {
LAB_001568dd:
        psVar22->x = 0;
        psVar22->y = 0;
      }
      else {
        uVar2 = psVar22->h;
        local_80 = (ulong)uVar2;
        if (uVar2 == 0) goto LAB_001568dd;
        iVar11 = context->align;
        iVar16 = (uint)uVar1 + iVar11 + -1;
        iVar16 = iVar16 - iVar16 % iVar11;
        local_70 = uVar7;
        if (iVar16 % iVar11 != 0) {
          __assert_fail("width % c->align == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_rectpack.h"
                        ,0x168,
                        "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)")
          ;
        }
        if ((context->width < iVar16) || (context->height < (int)(uint)uVar2)) {
          uVar8 = 0;
          in_R8 = (stbrp_node **)0x0;
        }
        else {
          uVar1 = *(ushort *)&((stbrp_context *)*ppsVar13)->width;
          local_40 = psVar22;
          local_38 = uVar12;
          if (context->width < (int)(iVar16 + (uint)uVar1)) {
            local_98 = 0x40000000;
            iVar11 = 0x40000000;
            local_90 = (stbrp_node **)0x0;
          }
          else {
            iVar11 = 0x40000000;
            local_90 = (stbrp_node **)0x0;
            local_98 = 0x40000000;
            psVar19 = (stbrp_context *)*ppsVar13;
            ppsVar20 = ppsVar13;
            do {
              iVar6 = stbrp__skyline_find_min_y
                                (psVar19,(stbrp_node *)(ulong)uVar1,iVar16,(int)&local_84,
                                 (int *)in_R8);
              if (context->heuristic == 0) {
                if (iVar6 < iVar11) {
                  local_90 = ppsVar20;
                  iVar11 = iVar6;
                }
              }
              else if (((int)local_80 + iVar6 <= context->height) &&
                      ((iVar6 < iVar11 || ((iVar6 == iVar11 && (local_84 < local_98)))))) {
                local_98 = local_84;
                local_90 = ppsVar20;
                iVar11 = iVar6;
              }
              ppsVar20 = (stbrp_node **)&psVar19->align;
              uVar1 = (ushort)(*(stbrp_context **)&psVar19->align)->width;
              psVar19 = *(stbrp_context **)&psVar19->align;
            } while ((int)(iVar16 + (uint)uVar1) <= context->width);
          }
          if (local_90 == (stbrp_node **)0x0) {
            local_94 = 0;
          }
          else {
            local_94 = (uint)(*local_90)->x;
          }
          if (context->heuristic == 1) {
            psVar19 = (stbrp_context *)*ppsVar13;
            uVar1 = (ushort)psVar19->width;
            psVar21 = psVar19;
            while ((int)(uint)uVar1 < iVar16) {
              psVar21 = *(stbrp_context **)&psVar21->align;
              uVar1 = (ushort)psVar21->width;
            }
            do {
              uVar17 = (uint)(ushort)psVar21->width - iVar16;
              ppsVar20 = ppsVar13;
              psVar5 = psVar19;
              if ((int)uVar17 < 0) {
                __assert_fail("xpos >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_rectpack.h"
                              ,0x1a8,
                              "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                             );
              }
              do {
                psVar19 = psVar5;
                ppsVar13 = ppsVar20;
                ppsVar20 = (stbrp_node **)&psVar19->align;
                psVar5 = *(stbrp_context **)&psVar19->align;
              } while ((int)(uint)(ushort)(*(stbrp_context **)&psVar19->align)->width <= (int)uVar17
                      );
              if ((int)uVar17 < (int)(uint)(ushort)psVar19->width) {
                __assert_fail("node->next->x > xpos && node->x <= xpos",
                              "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_rectpack.h"
                              ,0x1ae,
                              "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                             );
              }
              iVar6 = stbrp__skyline_find_min_y
                                (psVar19,(stbrp_node *)(ulong)uVar17,iVar16,(int)&local_88,
                                 (int *)in_R8);
              if ((((int)local_80 + iVar6 <= local_68->height) && (iVar6 <= iVar11)) &&
                 (((iVar6 < iVar11 || (local_88 < local_98)) ||
                  ((local_88 == local_98 && ((int)uVar17 < (int)local_94)))))) {
                local_98 = local_88;
                local_94 = uVar17;
                local_90 = ppsVar13;
                iVar11 = iVar6;
              }
              psVar21 = *(stbrp_context **)&psVar21->align;
            } while (psVar21 != (stbrp_context *)0x0);
          }
          uVar8 = CONCAT44(iVar11,local_94);
          rects = local_48;
          ppsVar13 = local_58;
          in_R8 = local_90;
          uVar12 = local_38;
          context = local_68;
          uVar18 = local_50;
          psVar22 = local_40;
        }
        if (((in_R8 == (stbrp_node **)0x0) ||
            (iVar11 = (int)local_80 + (int)((ulong)uVar8 >> 0x20), context->height < iVar11)) ||
           (psVar3 = context->free_head, psVar3 == (stbrp_node *)0x0)) {
          psVar22->x = 0xffff;
          psVar22->y = 0xffff;
        }
        else {
          psVar3->x = (stbrp_coord)uVar8;
          psVar3->y = (stbrp_coord)iVar11;
          context->free_head = psVar3->next;
          psVar15 = *in_R8;
          iVar11 = (int)uVar8;
          psVar14 = psVar15;
          if ((int)(uint)psVar15->x < iVar11) {
            psVar14 = psVar15->next;
            in_R8 = &psVar15->next;
          }
          *in_R8 = psVar3;
          if (psVar14->next != (stbrp_node *)0x0) {
            in_R8 = &psVar14->next;
            psVar15 = psVar14->next;
            do {
              if (iVar11 + (int)local_70 < (int)(uint)psVar15->x) break;
              *in_R8 = context->free_head;
              context->free_head = psVar14;
              in_R8 = &psVar15->next;
              ppsVar20 = &psVar15->next;
              psVar14 = psVar15;
              psVar15 = *ppsVar20;
            } while (*ppsVar20 != (stbrp_node *)0x0);
          }
          psVar3->next = psVar14;
          iVar11 = (int)local_70 + iVar11;
          if ((int)(uint)psVar14->x < iVar11) {
            psVar14->x = (stbrp_coord)iVar11;
          }
          psVar22->x = (stbrp_coord)uVar8;
          psVar22->y = (stbrp_coord)((ulong)uVar8 >> 0x20);
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar18);
  }
  qsort(rects,local_60,0x10,rect_original_order);
  lVar9 = extraout_RAX;
  if (0 < (int)local_78) {
    lVar9 = 0;
    do {
      bVar23 = true;
      if (*(short *)((long)&rects->x + lVar9) == -1) {
        bVar23 = *(short *)((long)&rects->y + lVar9) != -1;
      }
      *(uint *)((long)&rects->was_packed + lVar9) = (uint)bVar23;
      lVar9 = lVar9 + 0x10;
    } while (uVar18 * 0x10 != lVar9);
  }
  return (int)lVar9;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}